

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomAction::read(DomAction *this,int __fd,void *__buf,size_t __nbytes)

{
  storage_type_conflict *psVar1;
  char cVar2;
  int iVar3;
  DomProperty *pDVar4;
  char16_t *pcVar5;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  QList<DomProperty_*> *this_00;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar6 = 0;
    do {
      psVar1 = *(storage_type_conflict **)(local_50.ptr + lVar6 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x10);
      local_68.m_data = psVar1;
      if (local_68.m_size == 4) {
        QVar10.m_data = L"name";
        QVar10.m_size = 4;
        QVar11.m_data = psVar1;
        QVar11.m_size = 4;
        cVar2 = QtPrivate::equalStrings(QVar11,QVar10);
        if (cVar2 == '\0') {
          QVar7.m_data = L"menu";
          QVar7.m_size = 4;
          QVar12.m_data = psVar1;
          QVar12.m_size = 4;
          cVar2 = QtPrivate::equalStrings(QVar12,QVar7);
          if (cVar2 == '\0') goto LAB_0015a366;
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar6 + 0x50),
                           *(longlong *)(local_50.ptr + lVar6 + 0x58));
          QString::operator=(&this->m_attr_menu,&local_80);
          this->m_has_attr_menu = true;
        }
        else {
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar6 + 0x50),
                           *(longlong *)(local_50.ptr + lVar6 + 0x58));
          QString::operator=(&this->m_attr_name,&local_80);
          this->m_has_attr_name = true;
        }
      }
      else {
LAB_0015a366:
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
      }
      if ((DomProperty *)local_80.d.d != (DomProperty *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar6 = lVar6 + 0x68;
    } while (local_50.size * 0x68 - lVar6 != 0);
  }
  iVar3 = QXmlStreamReader::error();
  if (iVar3 == 0) {
    do {
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QVar10 = (QStringView)QXmlStreamReader::name();
        QVar8.m_data = L"property";
        QVar8.m_size = 8;
        pcVar5 = L"property";
        local_68 = QVar10;
        iVar3 = QtPrivate::compareStrings(QVar10,QVar8,CaseInsensitive);
        if (iVar3 == 0) {
          pDVar4 = (DomProperty *)operator_new(0x178);
          memset(pDVar4,0,0x178);
          DomProperty::read(pDVar4,__fd,__buf_00,(size_t)pcVar5);
          local_80.d.d = (Data *)pDVar4;
          QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                    ((QPodArrayOps<DomProperty*> *)&this->m_property,(this->m_property).d.size,
                     (DomProperty **)&local_80);
          this_00 = &this->m_property;
        }
        else {
          QVar9.m_data = L"attribute";
          QVar9.m_size = 9;
          pcVar5 = L"attribute";
          iVar3 = QtPrivate::compareStrings(QVar10,QVar9,CaseInsensitive);
          if (iVar3 != 0) {
            local_98.a.m_size = 0x13;
            local_98.a.m_data = "Unexpected element ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
            if ((DomProperty *)local_80.d.d != (DomProperty *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_80.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto LAB_0015a563;
          }
          pDVar4 = (DomProperty *)operator_new(0x178);
          memset(pDVar4,0,0x178);
          DomProperty::read(pDVar4,__fd,__buf_01,(size_t)pcVar5);
          local_80.d.d = (Data *)pDVar4;
          QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                    ((QPodArrayOps<DomProperty*> *)&this->m_attribute,(this->m_attribute).d.size,
                     (DomProperty **)&local_80);
          this_00 = &this->m_attribute;
        }
        QList<DomProperty_*>::end(this_00);
      }
      else if (iVar3 == 5) break;
LAB_0015a563:
      iVar3 = QXmlStreamReader::error();
    } while (iVar3 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomAction::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"menu"_s) {
            setAttributeMenu(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}